

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

void google::protobuf::anon_unknown_12::ByteSizeConsistencyError
               (size_t byte_size_before_serialization,size_t byte_size_after_serialization,
               size_t bytes_produced_by_serialization,MessageLite *message)

{
  LogMessage *pLVar1;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  if (byte_size_before_serialization != byte_size_after_serialization) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x44);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                       );
    (*message->_vptr_MessageLite[2])(&local_78,message);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,&local_78);
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1," was modified concurrently during serialization.");
    internal::LogFinisher::operator=(&local_79,pLVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (bytes_produced_by_serialization != byte_size_before_serialization) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x47);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                       );
    (*message->_vptr_MessageLite[2])(&local_78,message);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,&local_78);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,".");
    internal::LogFinisher::operator=(&local_79,pLVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
             ,0x4b);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_58,"This shouldn\'t be called if all the sizes are equal.");
  internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar1);
  internal::LogMessage::~LogMessage(&local_58);
  return;
}

Assistant:

void ByteSizeConsistencyError(size_t byte_size_before_serialization,
                              size_t byte_size_after_serialization,
                              size_t bytes_produced_by_serialization,
                              const MessageLite& message) {
  GOOGLE_CHECK_EQ(byte_size_before_serialization, byte_size_after_serialization)
      << message.GetTypeName()
      << " was modified concurrently during serialization.";
  GOOGLE_CHECK_EQ(bytes_produced_by_serialization, byte_size_before_serialization)
      << "Byte size calculation and serialization were inconsistent.  This "
         "may indicate a bug in protocol buffers or it may be caused by "
         "concurrent modification of " << message.GetTypeName() << ".";
  GOOGLE_LOG(FATAL) << "This shouldn't be called if all the sizes are equal.";
}